

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O0

void __thiscall
Assimp::ComputeUVMappingProcess::ComputePlaneMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  float fVar1;
  float fVar2;
  aiVector3t<float> aVar3;
  float local_d8;
  float local_d0;
  aiVector3D pos_3;
  uint pnt_3;
  aiMatrix4x4 mTrafo;
  aiVector3D *pos_2;
  uint pnt_2;
  aiVector3D *pos_1;
  uint pnt_1;
  aiVector3D *pos;
  uint pnt;
  aiVector3D max;
  aiVector3D min;
  aiVector3D center;
  ai_real diffv;
  ai_real diffu;
  aiVector3D *out_local;
  aiVector3D *axis_local;
  aiMesh *mesh_local;
  ComputeUVMappingProcess *this_local;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&min.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&max.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&pos + 4));
  fVar1 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_x);
  if (fVar1 < 0.95) {
    fVar1 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y);
    if (fVar1 < 0.95) {
      fVar1 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_z);
      if (fVar1 < 0.95) {
        aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&pos_3.z);
        aiMatrix4x4t<float>::FromToMatrix
                  (axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y,
                   (aiMatrix4x4t<float> *)&pos_3.z);
        FindMeshCenterTransformed
                  (mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)((long)&pos + 4),
                   (aiMatrix4x4 *)&pos_3.z);
        fVar1 = pos._4_4_ - max.y;
        fVar2 = max.x - min.x;
        for (pos_3.y = 0.0; (uint)pos_3.y < mesh->mNumVertices; pos_3.y = (float)((int)pos_3.y + 1))
        {
          aVar3 = ::operator*((aiMatrix4x4t<float> *)&pos_3.z,mesh->mVertices + (uint)pos_3.y);
          local_d8 = aVar3.z;
          pos_3.x = local_d8;
          local_d0 = aVar3.x;
          aiVector3t<float>::Set
                    (out + (uint)pos_3.y,(local_d0 - max.y) / fVar1,(local_d8 - min.x) / fVar2,0.0);
        }
      }
      else {
        FindMeshCenter(mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)((long)&pos + 4)
                      );
        fVar1 = pos._4_4_ - max.y;
        fVar2 = (float)pnt - max.z;
        for (pos_2._4_4_ = 0; pos_2._4_4_ < mesh->mNumVertices; pos_2._4_4_ = pos_2._4_4_ + 1) {
          aiVector3t<float>::Set
                    (out + pos_2._4_4_,(mesh->mVertices[pos_2._4_4_].x - max.y) / fVar1,
                     (mesh->mVertices[pos_2._4_4_].y - max.z) / fVar2,0.0);
        }
      }
    }
    else {
      FindMeshCenter(mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)((long)&pos + 4));
      fVar1 = pos._4_4_ - max.y;
      fVar2 = max.x - min.x;
      for (pos_1._4_4_ = 0; pos_1._4_4_ < mesh->mNumVertices; pos_1._4_4_ = pos_1._4_4_ + 1) {
        aiVector3t<float>::Set
                  (out + pos_1._4_4_,(mesh->mVertices[pos_1._4_4_].x - max.y) / fVar1,
                   (mesh->mVertices[pos_1._4_4_].z - min.x) / fVar2,0.0);
      }
    }
  }
  else {
    FindMeshCenter(mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)((long)&pos + 4));
    fVar1 = max.x - min.x;
    fVar2 = (float)pnt - max.z;
    for (pos._0_4_ = 0; (uint)pos < mesh->mNumVertices; pos._0_4_ = (uint)pos + 1) {
      aiVector3t<float>::Set
                (out + (uint)pos,(mesh->mVertices[(uint)pos].z - min.x) / fVar1,
                 (mesh->mVertices[(uint)pos].y - max.z) / fVar2,0.0);
    }
  }
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputePlaneMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    ai_real diffu,diffv;
    aiVector3D center, min, max;

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.z - min.z;
        diffv = max.y - min.y;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.z - min.z) / diffu,(pos.y - min.y) / diffv,0.0);
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.x - min.x;
        diffv = max.z - min.z;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.z - min.z) / diffv,0.0);
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.x - min.x;
        diffv = max.y - min.y;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.y - min.y) / diffv,0.0);
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else
    {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);
        FindMeshCenterTransformed(mesh, center, min, max,mTrafo);
        diffu = max.x - min.x;
        diffv = max.z - min.z;

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D pos = mTrafo * mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.z - min.z) / diffv,0.0);
        }
    }

    // shouldn't be necessary to remove UV seams ...
}